

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

Vec_Int_t *
Gia_PolynCoreOrder(Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Int_t *vAddCos,Vec_Int_t **pvIns,
                  Vec_Int_t **pvOuts)

{
  int iVar1;
  uint uVar2;
  Vec_Wec_t *vMap_00;
  Vec_Int_t *p;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar3;
  int local_4c;
  int Driver;
  int i;
  Vec_Int_t *vRoots;
  Vec_Wec_t *vMap;
  Vec_Int_t *vOrder;
  Vec_Int_t **pvOuts_local;
  Vec_Int_t **pvIns_local;
  Vec_Int_t *vAddCos_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManObjNum(pGia);
  vMap_00 = Gia_PolynComputeMap(vAdds,iVar1);
  iVar1 = Gia_ManCoNum(pGia);
  p = Vec_IntAlloc(iVar1);
  for (local_4c = 0; iVar1 = Vec_IntSize(pGia->vCos), local_4c < iVar1; local_4c = local_4c + 1) {
    pObj = Gia_ManCo(pGia,local_4c);
    iVar1 = Gia_ObjFaninId0p(pGia,pObj);
    Vec_IntPush(p,iVar1);
  }
  if (vAddCos != (Vec_Int_t *)0x0) {
    for (local_4c = 0; iVar1 = Vec_IntSize(vAddCos), local_4c < iVar1; local_4c = local_4c + 1) {
      iVar1 = Vec_IntEntry(vAddCos,local_4c);
      Vec_IntPush(p,iVar1);
    }
  }
  if (pvOuts != (Vec_Int_t **)0x0) {
    pVVar3 = Vec_IntDup(p);
    *pvOuts = pVVar3;
  }
  pVVar3 = Gia_PolynCoreOrder_int(pGia,vAdds,vMap_00,p,pvIns);
  Vec_IntFree(p);
  Vec_WecFree(vMap_00);
  uVar2 = Vec_IntSize(pVVar3);
  printf("Collected %d boxes.\n",(ulong)uVar2);
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_PolynCoreOrder( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Int_t * vAddCos, Vec_Int_t ** pvIns, Vec_Int_t ** pvOuts )
{
    Vec_Int_t * vOrder;
    Vec_Wec_t * vMap = Gia_PolynComputeMap( vAdds, Gia_ManObjNum(pGia) );
    Vec_Int_t * vRoots = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    int i, Driver;
    // collect roots
    Gia_ManForEachCoDriverId( pGia, Driver, i )
        Vec_IntPush( vRoots, Driver );
    // collect additional outputs
    if ( vAddCos )
        Vec_IntForEachEntry( vAddCos, Driver, i )
            Vec_IntPush( vRoots, Driver );
    // remember roots
    if ( pvOuts )
        *pvOuts = Vec_IntDup( vRoots );
    // create order
    vOrder = Gia_PolynCoreOrder_int( pGia, vAdds, vMap, vRoots, pvIns );
    Vec_IntFree( vRoots );
    Vec_WecFree( vMap );
    printf( "Collected %d boxes.\n", Vec_IntSize(vOrder) );
    return vOrder;
}